

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

bool __thiscall
kj::Function<bool_(capnp::MessageBuilder_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1657:35)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1657:35)>
             *this,MessageBuilder *params)

{
  uint *puVar1;
  undefined4 uVar2;
  bool bVar3;
  DebugExpression<bool> _kjCondition_1;
  Reader call;
  Reader desc;
  Reader message;
  Reader capTable;
  DebugComparison<unsigned_int,_int> _kjCondition;
  bool local_290 [24];
  StructReader local_278;
  StructReader local_248;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  short *local_208;
  WirePointer *local_200;
  uint local_1f8;
  short local_1f4;
  undefined4 local_1f0;
  ListReader local_1e8;
  undefined1 local_1b8 [24];
  WirePointer *local_1a0;
  undefined1 local_198;
  undefined2 local_194;
  int local_190;
  
  capnp::MessageBuilder::getRootInternal((Builder *)&local_1e8,params);
  local_278.data = local_1e8.ptr;
  local_278.segment = local_1e8.segment;
  local_278.capTable = local_1e8.capTable;
  capnp::_::PointerBuilder::getStruct
            ((StructBuilder *)local_1b8,(PointerBuilder *)&local_278,(StructSize)0x10001,(word *)0x0
            );
  capnp::_::StructBuilder::asReader((StructBuilder *)local_1b8);
  if ((0xf < local_1f8) && (*local_208 == 2)) {
    bVar3 = local_1f4 == 0;
    local_1b8._16_8_ = local_200;
    if (bVar3) {
      local_1b8._16_8_ = (WirePointer *)0x0;
    }
    uVar2 = 0x7fffffff;
    if (!bVar3) {
      uVar2 = local_1f0;
    }
    local_1b8._0_4_ = 0;
    local_1b8._4_4_ = 0;
    local_1b8._8_4_ = 0;
    local_1b8._12_4_ = 0;
    if (!bVar3) {
      local_1b8._0_4_ = local_218;
      local_1b8._4_4_ = uStack_214;
      local_1b8._8_4_ = uStack_210;
      local_1b8._12_4_ = uStack_20c;
    }
    local_1a0 = (WirePointer *)CONCAT44(local_1a0._4_4_,uVar2);
    capnp::_::PointerReader::getStruct(&local_278,(PointerReader *)local_1b8,(word *)0x0);
    if (((0x7f < local_278.dataSize) && (*(long *)((long)local_278.data + 8) == -0x2238f40687becc31)
        ) && (*(short *)((long)local_278.data + 4) == 0)) {
      local_248.data = local_278.pointers + 1;
      if (local_278.pointerCount < 2) {
        local_248.data = (WirePointer *)0x0;
      }
      if (local_278.pointerCount < 2) {
        local_278.nestingLimit = 0x7fffffff;
        local_248.segment._0_4_ = 0;
        local_248.segment._4_4_ = 0;
        local_248.capTable._0_4_ = 0;
        local_248.capTable._4_4_ = 0;
      }
      else {
        local_248.segment._0_4_ = local_278.segment._0_4_;
        local_248.segment._4_4_ = local_278.segment._4_4_;
        local_248.capTable._0_4_ = local_278.capTable._0_4_;
        local_248.capTable._4_4_ = local_278.capTable._4_4_;
      }
      local_248.pointers._0_4_ = local_278.nestingLimit;
      capnp::_::PointerReader::getStruct
                ((StructReader *)local_1b8,(PointerReader *)&local_248,(word *)0x0);
      local_248.data = (WirePointer *)0x0;
      local_248.pointers._0_4_ = 0x7fffffff;
      if (OVERLOADED < (ushort)local_194) {
        local_248.data = local_1a0 + 1;
        local_248.pointers._0_4_ = local_190;
      }
      local_248.segment._0_4_ = 0;
      local_248.segment._4_4_ = 0;
      local_248.capTable._0_4_ = 0;
      local_248.capTable._4_4_ = 0;
      if (OVERLOADED < (ushort)local_194) {
        local_248.segment._0_4_ = local_1b8._0_4_;
        local_248.segment._4_4_ = local_1b8._4_4_;
        local_248.capTable._0_4_ = local_1b8._8_4_;
        local_248.capTable._4_4_ = local_1b8._12_4_;
      }
      capnp::_::PointerReader::getList
                (&local_1e8,(PointerReader *)&local_248,INLINE_COMPOSITE,(word *)0x0);
      local_1b8._0_4_ = local_1e8.elementCount;
      local_1b8._4_4_ = 1;
      local_1b8._8_8_ = " == ";
      local_1b8._16_8_ = &DAT_00000005;
      local_1a0 = (WirePointer *)CONCAT71(local_1a0._1_7_,local_1e8.elementCount == 1);
      if (local_1e8.elementCount == 1) {
        capnp::_::ListReader::getStructElement(&local_248,&local_1e8,0);
        if (local_248.dataSize < 0x10) {
          local_290[0] = false;
        }
        else {
          local_290[0] = (short)((WireValue<uint32_t>_conflict *)local_248.data)->value == 2;
          if (local_290[0]) {
            local_1b8._0_4_ = 0;
            if (0x3f < local_248.dataSize) {
              local_1b8._0_4_ =
                   ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_248.data + 4))->
                   upper32Bits;
            }
            local_1b8._8_8_ = (this->f).expectedExportNumber;
            local_198 = local_1b8._0_4_ ==
                        *(uint32_t *)
                         &((CapTableReader *)
                          &((CapTableReader *)local_1b8._8_8_)->_vptr_CapTableReader)->
                          _vptr_CapTableReader;
            local_1b8._16_8_ = " == ";
            local_1a0 = (WirePointer *)&DAT_00000005;
            if ((bool)local_198) {
              puVar1 = (this->f).interceptCount;
              *puVar1 = *puVar1 + 1;
              if (*(this->f).shouldThrowFromSend != true) {
                return true;
              }
              kj::_::Debug::makeDescription<char_const(&)[12]>
                        ((String *)local_290,(Debug *)0x505e9f,"intercepted",
                         (char (*) [12])local_248.data);
              Exception::Exception
                        ((Exception *)local_1b8,FAILED,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                         ,0x689,(String *)local_290);
              throwFatalException((Exception *)local_1b8,0);
            }
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int&>&>
                      ((Fault *)local_290,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                       ,0x685,FAILED,"desc.getSenderPromise() == expectedExportNumber",
                       "_kjCondition,",(DebugComparison<unsigned_int,_unsigned_int_&> *)local_1b8);
            kj::_::Debug::Fault::fatal((Fault *)local_290);
          }
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                  ((Fault *)local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                   ,0x684,FAILED,"desc.isSenderPromise()","_kjCondition,",
                   (DebugExpression<bool> *)local_290);
        kj::_::Debug::Fault::fatal((Fault *)local_1b8);
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
                ((Fault *)&local_248,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x682,FAILED,"capTable.size() == 1","_kjCondition,",
                 (DebugComparison<unsigned_int,_int> *)local_1b8);
      kj::_::Debug::Fault::fatal((Fault *)&local_248);
    }
  }
  return true;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }